

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

void Abc_NtkAreaOpt2(Sfm_Dec_t *p)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  undefined8 uVar5;
  Abc_Obj_t *pAVar6;
  uint *__ptr;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  Abc_Ntk_t *pAVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  
  pAVar14 = p->pNtk;
  pVVar8 = pAVar14->vObjs;
  iVar2 = pVVar8->nSize;
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  pvVar7 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar7;
  if (0 < (long)iVar2) {
    lVar11 = 0;
    do {
      pvVar7 = pVVar8->pArray[lVar11];
      if ((pvVar7 != (void *)0x0) && ((*(byte *)((long)pvVar7 + 0x14) & 0x20) != 0)) {
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x799,"void Abc_NtkAreaOpt2(Sfm_Dec_t *)");
      }
      lVar11 = lVar11 + 1;
    } while (iVar2 != lVar11);
  }
  pVVar8 = pAVar14->vCos;
  if (0 < pVVar8->nSize) {
    iVar15 = 0;
    uVar17 = 1000;
    lVar11 = 0;
    do {
      plVar4 = (long *)pVVar8->pArray[lVar11];
      lVar12 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
      uVar3 = *(uint *)(lVar12 + 0x14);
      if ((uVar3 & 0x2f) == 7) {
        *(uint *)(lVar12 + 0x14) = uVar3 | 0x20;
        uVar5 = *(undefined8 *)
                 (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
        iVar16 = (int)uVar17;
        if (iVar15 == iVar16) {
          if (iVar16 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar7;
            *__ptr = 0x10;
            uVar17 = 0x10;
          }
          else {
            uVar17 = (ulong)(uint)(iVar16 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(uVar17 * 8);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),uVar17 * 8);
            }
            *(void **)(__ptr + 2) = pvVar7;
            *__ptr = iVar16 * 2;
          }
        }
        else {
          pvVar7 = *(void **)(__ptr + 2);
        }
        lVar12 = (long)iVar15;
        iVar15 = iVar15 + 1;
        *(undefined8 *)((long)pvVar7 + lVar12 * 8) = uVar5;
        pAVar14 = p->pNtk;
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pAVar14->vCos;
    } while (lVar11 < pVVar8->nSize);
    if (0 < iVar15) {
      lVar11 = 0;
      do {
        pvVar7 = *(void **)(__ptr + 2);
        pAVar6 = *(Abc_Obj_t **)((long)pvVar7 + lVar11 * 8);
        if ((pAVar6->field_0x14 & 0xf) != 0) {
          pAVar9 = Abc_NtkAreaOptOne(p,pAVar6->Id);
          if (pAVar9 == (Abc_Obj_t *)0x0) {
            iVar16 = (pAVar6->vFanins).nSize;
            pAVar9 = pAVar6;
LAB_0052db63:
            if (0 < iVar16) {
              lVar12 = 0;
              do {
                pvVar7 = pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[lVar12]];
                if ((*(uint *)((long)pvVar7 + 0x14) & 0x2f) == 7) {
                  *(uint *)((long)pvVar7 + 0x14) = *(uint *)((long)pvVar7 + 0x14) | 0x20;
                  iVar16 = (int)uVar17;
                  if (iVar15 == iVar16) {
                    if (iVar16 < 0x10) {
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar10 = malloc(0x80);
                      }
                      else {
                        pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
                      }
                      *(void **)(__ptr + 2) = pvVar10;
                      *__ptr = 0x10;
                      uVar17 = 0x10;
                    }
                    else {
                      uVar17 = (ulong)(uint)(iVar16 * 2);
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar10 = malloc(uVar17 * 8);
                      }
                      else {
                        pvVar10 = realloc(*(void **)(__ptr + 2),uVar17 * 8);
                      }
                      *(void **)(__ptr + 2) = pvVar10;
                      *__ptr = iVar16 * 2;
                    }
                  }
                  else {
                    pvVar10 = *(void **)(__ptr + 2);
                  }
                  lVar13 = (long)iVar15;
                  iVar15 = iVar15 + 1;
                  *(void **)((long)pvVar10 + lVar13 * 8) = pvVar7;
                  iVar16 = (pAVar9->vFanins).nSize;
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 < iVar16);
            }
          }
          else {
            uVar3 = *(uint *)&pAVar9->field_0x14;
            if (((uVar3 & 0xf) == 7) &&
               (iVar16 = (pAVar9->vFanins).nSize, (char)((uVar3 & 0x20) >> 5) == '\0' && iVar16 != 0
               )) {
              if (iVar2 <= pAVar9->Id) goto LAB_0052db63;
              *(uint *)&pAVar9->field_0x14 = uVar3 | 0x20;
              iVar16 = (int)uVar17;
              if (iVar15 == iVar16) {
                if (iVar16 < 0x10) {
                  pvVar7 = realloc(pvVar7,0x80);
                  uVar17 = 0x10;
                }
                else {
                  uVar17 = (ulong)(uint)(iVar16 * 2);
                  pvVar7 = realloc(pvVar7,uVar17 * 8);
                }
                *(void **)(__ptr + 2) = pvVar7;
                *__ptr = (uint)uVar17;
              }
              lVar12 = (long)iVar15;
              iVar15 = iVar15 + 1;
              *(Abc_Obj_t **)((long)pvVar7 + lVar12 * 8) = pAVar9;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar15);
      pAVar14 = p->pNtk;
    }
  }
  pVVar8 = pAVar14->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      if (pVVar8->pArray[lVar11] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar8->pArray[lVar11] + 0x14);
        *pbVar1 = *pbVar1 & 0xdf;
        pAVar14 = p->pNtk;
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pAVar14->vObjs;
    } while (lVar11 < pVVar8->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkAreaOpt2( Sfm_Dec_t * p )
{
    Abc_Obj_t * pObj, * pObjNew, * pFanin; 
    int i, k, nStop = Abc_NtkObjNumMax(p->pNtk);
    Vec_Ptr_t * vFront = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachObj( p->pNtk, pObj, i )
        assert( pObj->fMarkB == 0 );
    // start the queue of nodes to be tried
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) && !Abc_ObjFanin0(pObj)->fMarkB )
        {
            Abc_ObjFanin0(pObj)->fMarkB = 1;
            Vec_PtrPush( vFront, Abc_ObjFanin0(pObj) );
        }
    // process nodes in this order
    Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, i )
    {
        if ( Abc_ObjIsNone(pObj) )
            continue;
        pObjNew = Abc_NtkAreaOptOne( p, Abc_ObjId(pObj) );
        if ( pObjNew != NULL )
        {
            if ( !Abc_ObjIsNode(pObjNew) || Abc_ObjFaninNum(pObjNew) == 0 || pObjNew->fMarkB )
                continue;
            if ( (int)Abc_ObjId(pObjNew) < nStop )
            {
                pObjNew->fMarkB = 1;
                Vec_PtrPush( vFront, pObjNew );
                continue;
            }
        }
        else
            pObjNew = pObj;
        Abc_ObjForEachFanin( pObjNew, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) && Abc_ObjFaninNum(pObjNew) > 0 && !pFanin->fMarkB )
            {
                pFanin->fMarkB = 1;
                Vec_PtrPush( vFront, pFanin );
            }
    }
    Abc_NtkForEachObj( p->pNtk, pObj, i )
        pObj->fMarkB = 0;
    Vec_PtrFree( vFront );
}